

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O0

char * vkt::texture::util::getProgramName(Program program)

{
  char *pcStack_10;
  Program program_local;
  
  switch(program) {
  case PROGRAM_2D_FLOAT:
    pcStack_10 = "2D_FLOAT";
    break;
  case PROGRAM_2D_INT:
    pcStack_10 = "2D_INT";
    break;
  case PROGRAM_2D_UINT:
    pcStack_10 = "2D_UINT";
    break;
  case PROGRAM_2D_SHADOW:
    pcStack_10 = "2D_SHADOW";
    break;
  case PROGRAM_2D_FLOAT_BIAS:
    pcStack_10 = "2D_FLOAT_BIAS";
    break;
  case PROGRAM_2D_INT_BIAS:
    pcStack_10 = "2D_INT_BIAS";
    break;
  case PROGRAM_2D_UINT_BIAS:
    pcStack_10 = "2D_UINT_BIAS";
    break;
  case PROGRAM_2D_SHADOW_BIAS:
    pcStack_10 = "2D_SHADOW_BIAS";
    break;
  case PROGRAM_1D_FLOAT:
    pcStack_10 = "1D_FLOAT";
    break;
  case PROGRAM_1D_INT:
    pcStack_10 = "1D_INT";
    break;
  case PROGRAM_1D_UINT:
    pcStack_10 = "1D_UINT";
    break;
  case PROGRAM_1D_SHADOW:
    pcStack_10 = "1D_SHADOW";
    break;
  case PROGRAM_1D_FLOAT_BIAS:
    pcStack_10 = "1D_FLOAT_BIAS";
    break;
  case PROGRAM_1D_INT_BIAS:
    pcStack_10 = "1D_INT_BIAS";
    break;
  case PROGRAM_1D_UINT_BIAS:
    pcStack_10 = "1D_UINT_BIAS";
    break;
  case PROGRAM_1D_SHADOW_BIAS:
    pcStack_10 = "1D_SHADOW_BIAS";
    break;
  case PROGRAM_CUBE_FLOAT:
    pcStack_10 = "CUBE_FLOAT";
    break;
  case PROGRAM_CUBE_INT:
    pcStack_10 = "CUBE_INT";
    break;
  case PROGRAM_CUBE_UINT:
    pcStack_10 = "CUBE_UINT";
    break;
  case PROGRAM_CUBE_SHADOW:
    pcStack_10 = "CUBE_SHADOW";
    break;
  case PROGRAM_CUBE_FLOAT_BIAS:
    pcStack_10 = "CUBE_FLOAT_BIAS";
    break;
  case PROGRAM_CUBE_INT_BIAS:
    pcStack_10 = "CUBE_INT_BIAS";
    break;
  case PROGRAM_CUBE_UINT_BIAS:
    pcStack_10 = "CUBE_UINT_BIAS";
    break;
  case PROGRAM_CUBE_SHADOW_BIAS:
    pcStack_10 = "CUBE_SHADOW_BIAS";
    break;
  case PROGRAM_1D_ARRAY_FLOAT:
    pcStack_10 = "1D_ARRAY_FLOAT";
    break;
  case PROGRAM_1D_ARRAY_INT:
    pcStack_10 = "1D_ARRAY_INT";
    break;
  case PROGRAM_1D_ARRAY_UINT:
    pcStack_10 = "1D_ARRAY_UINT";
    break;
  case PROGRAM_1D_ARRAY_SHADOW:
    pcStack_10 = "1D_ARRAY_SHADOW";
    break;
  case PROGRAM_2D_ARRAY_FLOAT:
    pcStack_10 = "2D_ARRAY_FLOAT";
    break;
  case PROGRAM_2D_ARRAY_INT:
    pcStack_10 = "2D_ARRAY_INT";
    break;
  case PROGRAM_2D_ARRAY_UINT:
    pcStack_10 = "2D_ARRAY_UINT";
    break;
  case PROGRAM_2D_ARRAY_SHADOW:
    pcStack_10 = "2D_ARRAY_SHADOW";
    break;
  case PROGRAM_3D_FLOAT:
    pcStack_10 = "3D_FLOAT";
    break;
  case PROGRAM_3D_INT:
    pcStack_10 = "3D_INT";
    break;
  case PROGRAM_3D_UINT:
    pcStack_10 = "3D_UINT";
    break;
  case PROGRAM_3D_FLOAT_BIAS:
    pcStack_10 = "3D_FLOAT_BIAS";
    break;
  case PROGRAM_3D_INT_BIAS:
    pcStack_10 = "3D_INT_BIAS";
    break;
  case PROGRAM_3D_UINT_BIAS:
    pcStack_10 = "3D_UINT_BIAS";
    break;
  case PROGRAM_CUBE_ARRAY_FLOAT:
    pcStack_10 = "CUBE_ARRAY_FLOAT";
    break;
  case PROGRAM_CUBE_ARRAY_INT:
    pcStack_10 = "CUBE_ARRAY_INT";
    break;
  case PROGRAM_CUBE_ARRAY_UINT:
    pcStack_10 = "CUBE_ARRAY_UINT";
    break;
  case PROGRAM_CUBE_ARRAY_SHADOW:
    pcStack_10 = "CUBE_ARRAY_SHADOW";
    break;
  case PROGRAM_BUFFER_FLOAT:
    pcStack_10 = "BUFFER_FLOAT";
    break;
  case PROGRAM_BUFFER_INT:
    pcStack_10 = "BUFFER_INT";
    break;
  case PROGRAM_BUFFER_UINT:
    pcStack_10 = "BUFFER_UINT";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getProgramName(Program program)
{
	switch (program)
	{
		case PROGRAM_2D_FLOAT:			return "2D_FLOAT";
		case PROGRAM_2D_INT:			return "2D_INT";
		case PROGRAM_2D_UINT:			return "2D_UINT";
		case PROGRAM_2D_SHADOW:			return "2D_SHADOW";
		case PROGRAM_2D_FLOAT_BIAS:		return "2D_FLOAT_BIAS";
		case PROGRAM_2D_INT_BIAS:		return "2D_INT_BIAS";
		case PROGRAM_2D_UINT_BIAS:		return "2D_UINT_BIAS";
		case PROGRAM_2D_SHADOW_BIAS:	return "2D_SHADOW_BIAS";
		case PROGRAM_1D_FLOAT:			return "1D_FLOAT";
		case PROGRAM_1D_INT:			return "1D_INT";
		case PROGRAM_1D_UINT:			return "1D_UINT";
		case PROGRAM_1D_SHADOW:			return "1D_SHADOW";
		case PROGRAM_1D_FLOAT_BIAS:		return "1D_FLOAT_BIAS";
		case PROGRAM_1D_INT_BIAS:		return "1D_INT_BIAS";
		case PROGRAM_1D_UINT_BIAS:		return "1D_UINT_BIAS";
		case PROGRAM_1D_SHADOW_BIAS:	return "1D_SHADOW_BIAS";
		case PROGRAM_CUBE_FLOAT:		return "CUBE_FLOAT";
		case PROGRAM_CUBE_INT:			return "CUBE_INT";
		case PROGRAM_CUBE_UINT:			return "CUBE_UINT";
		case PROGRAM_CUBE_SHADOW:		return "CUBE_SHADOW";
		case PROGRAM_CUBE_FLOAT_BIAS:	return "CUBE_FLOAT_BIAS";
		case PROGRAM_CUBE_INT_BIAS:		return "CUBE_INT_BIAS";
		case PROGRAM_CUBE_UINT_BIAS:	return "CUBE_UINT_BIAS";
		case PROGRAM_CUBE_SHADOW_BIAS:	return "CUBE_SHADOW_BIAS";
		case PROGRAM_2D_ARRAY_FLOAT:	return "2D_ARRAY_FLOAT";
		case PROGRAM_2D_ARRAY_INT:		return "2D_ARRAY_INT";
		case PROGRAM_2D_ARRAY_UINT:		return "2D_ARRAY_UINT";
		case PROGRAM_2D_ARRAY_SHADOW:	return "2D_ARRAY_SHADOW";
		case PROGRAM_3D_FLOAT:			return "3D_FLOAT";
		case PROGRAM_3D_INT:			return "3D_INT";
		case PROGRAM_3D_UINT:			return "3D_UINT";
		case PROGRAM_3D_FLOAT_BIAS:		return "3D_FLOAT_BIAS";
		case PROGRAM_3D_INT_BIAS:		return "3D_INT_BIAS";
		case PROGRAM_3D_UINT_BIAS:		return "3D_UINT_BIAS";
		case PROGRAM_CUBE_ARRAY_FLOAT:	return "CUBE_ARRAY_FLOAT";
		case PROGRAM_CUBE_ARRAY_INT:	return "CUBE_ARRAY_INT";
		case PROGRAM_CUBE_ARRAY_UINT:	return "CUBE_ARRAY_UINT";
		case PROGRAM_CUBE_ARRAY_SHADOW:	return "CUBE_ARRAY_SHADOW";
		case PROGRAM_1D_ARRAY_FLOAT:	return "1D_ARRAY_FLOAT";
		case PROGRAM_1D_ARRAY_INT:		return "1D_ARRAY_INT";
		case PROGRAM_1D_ARRAY_UINT:		return "1D_ARRAY_UINT";
		case PROGRAM_1D_ARRAY_SHADOW:	return "1D_ARRAY_SHADOW";
		case PROGRAM_BUFFER_FLOAT:		return "BUFFER_FLOAT";
		case PROGRAM_BUFFER_INT:		return "BUFFER_INT";
		case PROGRAM_BUFFER_UINT:		return "BUFFER_UINT";
		default:
			DE_ASSERT(false);
	}
	return NULL;
}